

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void resizeDeepBuffers<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels)

{
  undefined1 auVar1 [16];
  bool bVar2;
  reference this;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  half **pphVar6;
  Array2D<unsigned_int> *in_RDI;
  uint32_t count;
  int x;
  int y;
  Array2D<Imath_3_2::half_*> *channel;
  iterator i;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  *in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  _Self local_20;
  _Self local_18 [2];
  Array2D<unsigned_int> *local_8;
  
  local_8 = in_RDI;
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar2 = std::operator!=(local_18,&local_20);
    if (!bVar2) break;
    this = std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_> *)0x11a12e);
    local_2c = 0;
    while( true ) {
      lVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::height(this);
      if (lVar3 <= local_2c) break;
      local_30 = 0;
      while( true ) {
        lVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::width(this);
        if (lVar3 <= local_30) break;
        puVar4 = Imf_3_4::Array2D<unsigned_int>::operator[](local_8,(long)local_2c);
        if (puVar4[local_30] == 0) {
          pphVar6 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](this,(long)local_2c);
          pphVar6[local_30] = (half *)0x0;
        }
        else {
          auVar1 = ZEXT416(puVar4[local_30]) * ZEXT816(2);
          uVar5 = auVar1._0_8_;
          if (auVar1._8_8_ != 0) {
            uVar5 = 0xffffffffffffffff;
          }
          in_stack_ffffffffffffffa8 =
               (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *)operator_new__(uVar5);
          pphVar6 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](this,(long)local_2c);
          pphVar6[local_30] = (half *)in_stack_ffffffffffffffa8;
        }
        local_30 = local_30 + 1;
      }
      local_2c = local_2c + 1;
    }
    std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator++(local_18,0);
  }
  return;
}

Assistant:

void
resizeDeepBuffers (Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels)
{
    //
    // Allocate memory for samples in all pixel buffers according to the data in sampleCount buffer.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                if (count)
                    channel[y][x]  = new T[count];
                else
                    channel[y][x]  = nullptr;
            }
        }
    }
}